

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

int __thiscall glslang::TInputScanner::peek(TInputScanner *this)

{
  ulong local_28;
  size_t charToRead;
  int sourceToRead;
  TInputScanner *this_local;
  
  if (this->currentSource < this->numSources) {
    charToRead._4_4_ = this->currentSource;
    local_28 = this->currentChar;
    do {
      if (local_28 < this->lengths[charToRead._4_4_]) {
        return (uint)this->sources[charToRead._4_4_][local_28];
      }
      local_28 = 0;
      charToRead._4_4_ = charToRead._4_4_ + 1;
    } while (charToRead._4_4_ < this->numSources);
  }
  else {
    this->endOfFileReached = true;
  }
  return -1;
}

Assistant:

int peek()
    {
        if (currentSource >= numSources) {
            endOfFileReached = true;
            return EndOfInput;
        }
        // Make sure we do not read off the end of a string.
        // N.B. Sources can have a length of 0.
        int sourceToRead = currentSource;
        size_t charToRead = currentChar;
        while(charToRead >= lengths[sourceToRead]) {
            charToRead = 0;
            sourceToRead += 1;
            if (sourceToRead >= numSources) {
                return EndOfInput;
            }
        }

        // Here, we care about making negative valued characters positive
        return sources[sourceToRead][charToRead];
    }